

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void opus_server_info_init(OpusServerInfo *_info)

{
  _info->server = (char *)0x0;
  _info->content_type = (char *)0x0;
  _info->genre = (char *)0x0;
  _info->url = (char *)0x0;
  _info->name = (char *)0x0;
  _info->description = (char *)0x0;
  _info->bitrate_kbps = -1;
  _info->is_public = -1;
  _info->is_ssl = 0;
  return;
}

Assistant:

void opus_server_info_init(OpusServerInfo *_info){
  _info->name=NULL;
  _info->description=NULL;
  _info->genre=NULL;
  _info->url=NULL;
  _info->server=NULL;
  _info->content_type=NULL;
  _info->bitrate_kbps=-1;
  _info->is_public=-1;
  _info->is_ssl=0;
}